

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O1

int Gia_ManRexNumInputs(char *pStr,Vec_Int_t **pvAlphas,Vec_Int_t **pvStr2Sta)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  Vec_Int_t *p;
  int *piVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  
  sVar4 = strlen(pStr);
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar5 = (int *)malloc(400);
  p->pArray = piVar5;
  uVar2 = (uint)sVar4;
  iVar9 = uVar2 + 1;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < uVar2) {
    iVar3 = iVar9;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar3;
  iVar8 = 0;
  if (iVar3 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar3 << 2);
  }
  pVVar6->pArray = piVar5;
  pVVar6->nSize = iVar9;
  memset(piVar5,0xff,(long)iVar9 << 2);
  uVar10 = 0;
  if (0 < (int)uVar2) {
    uVar10 = 0;
    iVar8 = 0;
    do {
      bVar1 = pStr[uVar10];
      if ((2 < bVar1 - 0x28) && (bVar1 != 0x7c)) {
        if (0 < (long)p->nSize) {
          lVar7 = 0;
          do {
            if (p->pArray[lVar7] == (int)(char)bVar1) goto LAB_0070c4ff;
            lVar7 = lVar7 + 1;
          } while (p->nSize != lVar7);
        }
        Vec_IntPush(p,(int)(char)bVar1);
LAB_0070c4ff:
        if ((long)pVVar6->nSize <= (long)uVar10) goto LAB_0070c54b;
        pVVar6->pArray[uVar10] = iVar8;
        iVar8 = iVar8 + 1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uVar2 & 0x7fffffff));
  }
  if ((int)uVar10 < pVVar6->nSize) {
    pVVar6->pArray[uVar10 & 0xffffffff] = iVar8;
    *pvAlphas = p;
    *pvStr2Sta = pVVar6;
    return iVar8;
  }
LAB_0070c54b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

int Gia_ManRexNumInputs( char * pStr, Vec_Int_t ** pvAlphas, Vec_Int_t ** pvStr2Sta )
{
    int i, nStates = 0, Length = strlen(pStr);
    Vec_Int_t * vAlphas  = Vec_IntAlloc( 100 );            // alphabet
    Vec_Int_t * vStr2Sta = Vec_IntStartFull( Length + 1 ); // symbol to state
    for ( i = 0; i < Length; i++ )
    {
        if ( Gia_SymbSpecial(pStr[i]) )
            continue;
        if ( Vec_IntFind(vAlphas, pStr[i]) == -1 )
            Vec_IntPush( vAlphas, pStr[i] );
        Vec_IntWriteEntry( vStr2Sta, i, nStates++ );
    }
    Vec_IntWriteEntry( vStr2Sta, i, nStates );
    *pvAlphas  = vAlphas;
    *pvStr2Sta = vStr2Sta;
    return nStates;
}